

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

AggregateFunction *
duckdb::GetModeAggregate(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  PhysicalType PVar1;
  LogicalType *in_RDX;
  
  PVar1 = type->physical_type_;
  if (PVar1 < VARCHAR) {
    switch(PVar1) {
    case UINT8:
      GetTypedModeFunction<unsigned_char,duckdb::ModeStandard<unsigned_char>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      break;
    case INT8:
      GetTypedModeFunction<signed_char,duckdb::ModeStandard<signed_char>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      break;
    case UINT16:
      GetTypedModeFunction<unsigned_short,duckdb::ModeStandard<unsigned_short>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      break;
    case INT16:
      GetTypedModeFunction<short,duckdb::ModeStandard<short>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      break;
    case UINT32:
      GetTypedModeFunction<unsigned_int,duckdb::ModeStandard<unsigned_int>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      break;
    case INT32:
      GetTypedModeFunction<int,duckdb::ModeStandard<int>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      break;
    case UINT64:
      GetTypedModeFunction<unsigned_long,duckdb::ModeStandard<unsigned_long>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      break;
    case INT64:
      GetTypedModeFunction<long,duckdb::ModeStandard<long>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      break;
    default:
      goto switchD_00de1ada_caseD_a;
    case FLOAT:
      GetTypedModeFunction<float,duckdb::ModeStandard<float>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      break;
    case DOUBLE:
      GetTypedModeFunction<double,duckdb::ModeStandard<double>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      break;
    case INTERVAL:
      GetTypedModeFunction<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
    }
  }
  else {
    if (PVar1 == VARCHAR) {
      GetTypedModeFunction<duckdb::string_t,duckdb::ModeString>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      return __return_storage_ptr__;
    }
    if (PVar1 == UINT128) {
      GetTypedModeFunction<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      return __return_storage_ptr__;
    }
    if (PVar1 == INT128) {
      GetTypedModeFunction<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      return __return_storage_ptr__;
    }
switchD_00de1ada_caseD_a:
    GetFallbackModeFunction(__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetModeAggregate(const LogicalType &type) {
	switch (type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::INT8:
		return GetTypedModeFunction<int8_t>(type);
	case PhysicalType::UINT8:
		return GetTypedModeFunction<uint8_t>(type);
	case PhysicalType::INT16:
		return GetTypedModeFunction<int16_t>(type);
	case PhysicalType::UINT16:
		return GetTypedModeFunction<uint16_t>(type);
	case PhysicalType::INT32:
		return GetTypedModeFunction<int32_t>(type);
	case PhysicalType::UINT32:
		return GetTypedModeFunction<uint32_t>(type);
	case PhysicalType::INT64:
		return GetTypedModeFunction<int64_t>(type);
	case PhysicalType::UINT64:
		return GetTypedModeFunction<uint64_t>(type);
	case PhysicalType::INT128:
		return GetTypedModeFunction<hugeint_t>(type);
	case PhysicalType::UINT128:
		return GetTypedModeFunction<uhugeint_t>(type);
	case PhysicalType::FLOAT:
		return GetTypedModeFunction<float>(type);
	case PhysicalType::DOUBLE:
		return GetTypedModeFunction<double>(type);
	case PhysicalType::INTERVAL:
		return GetTypedModeFunction<interval_t>(type);
	case PhysicalType::VARCHAR:
		return GetTypedModeFunction<string_t, ModeString>(type);
#endif
	default:
		return GetFallbackModeFunction(type);
	}
}